

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# upnpapi.c
# Opt level: O1

int UpnpGetServiceVarStatus
              (UpnpClient_Handle Hnd,char *ActionURL_const,char *VarName_const,char **StVar)

{
  Upnp_Handle_Type UVar1;
  int iVar2;
  int line;
  Handle_Info *SInfo;
  char *StVarPtr;
  Handle_Info *local_38;
  char *local_30;
  
  line = (int)&local_38;
  local_38 = (Handle_Info *)0x0;
  iVar2 = -0x74;
  if (UpnpSdkInit == 1) {
    iVar2 = 6;
    UpnpPrintf(UPNP_ALL,API,".upnp/src/api/upnpapi.c",0xce8,"Inside UpnpGetServiceVarStatus\n");
    HandleReadLock((char *)0xceb,iVar2);
    UVar1 = GetHandleInfo(Hnd,&local_38);
    if (UVar1 == HND_CLIENT) {
      HandleUnlock((char *)0xcf4,line);
      iVar2 = -0x65;
      if ((ActionURL_const != (char *)0x0) &&
         (StVar != (char **)0x0 && VarName_const != (char *)0x0)) {
        iVar2 = SoapGetServiceVarStatus(ActionURL_const,VarName_const,&local_30);
        *StVar = local_30;
        UpnpPrintf(UPNP_ALL,API,".upnp/src/api/upnpapi.c",0xd03,"Exiting UpnpGetServiceVarStatus \n"
                  );
      }
    }
    else {
      HandleUnlock((char *)0xcf0,line);
      iVar2 = -100;
    }
  }
  return iVar2;
}

Assistant:

int UpnpGetServiceVarStatus(UpnpClient_Handle Hnd,
	const char *ActionURL_const,
	const char *VarName_const,
	DOMString *StVar)
{
	struct Handle_Info *SInfo = NULL;
	int retVal = 0;
	char *StVarPtr;
	char *ActionURL = (char *)ActionURL_const;
	char *VarName = (char *)VarName_const;

	if (UpnpSdkInit != 1) {
		return UPNP_E_FINISH;
	}

	UpnpPrintf(UPNP_ALL,
		API,
		__FILE__,
		__LINE__,
		"Inside UpnpGetServiceVarStatus\n");

	HandleReadLock(__FILE__, __LINE__);
	switch (GetHandleInfo(Hnd, &SInfo)) {
	case HND_CLIENT:
		break;
	default:
		HandleUnlock(__FILE__, __LINE__);
		return UPNP_E_INVALID_HANDLE;
	}

	HandleUnlock(__FILE__, __LINE__);

	if (ActionURL == NULL) {
		return UPNP_E_INVALID_PARAM;
	}
	if (VarName == NULL || StVar == NULL) {
		return UPNP_E_INVALID_PARAM;
	}

	retVal = SoapGetServiceVarStatus(ActionURL, VarName, &StVarPtr);
	*StVar = StVarPtr;

	UpnpPrintf(UPNP_ALL,
		API,
		__FILE__,
		__LINE__,
		"Exiting UpnpGetServiceVarStatus \n");

	return retVal;
}